

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

void prep_huffman(vorb *f)

{
  int iVar1;
  int iVar2;
  
  if (f->valid_bits < 0x19) {
    if (f->valid_bits == 0) {
      f->acc = 0;
    }
    do {
      if ((f->last_seg != 0) && (f->bytes_in_seg == '\0')) {
        return;
      }
      iVar2 = get8_packet_raw(f);
      if (iVar2 == -1) {
        return;
      }
      iVar1 = f->valid_bits;
      f->acc = f->acc + (iVar2 << ((byte)iVar1 & 0x1f));
      f->valid_bits = iVar1 + 8;
    } while (iVar1 < 0x11);
  }
  return;
}

Assistant:

static __forceinline void prep_huffman(vorb *f)
{
   if (f->valid_bits <= 24) {
      if (f->valid_bits == 0) f->acc = 0;
      do {
         int z;
         if (f->last_seg && !f->bytes_in_seg) return;
         z = get8_packet_raw(f);
         if (z == EOP) return;
         f->acc += (unsigned) z << f->valid_bits;
         f->valid_bits += 8;
      } while (f->valid_bits <= 24);
   }
}